

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLFormulasLinker.cpp
# Opt level: O1

size_t __thiscall
COLLADASaxFWL::FormulasLinker::getNewParamIndex
          (FormulasLinker *this,Formula *formula,String *parameterName,bool *found)

{
  ulong uVar1;
  FormulaNewParam **ppFVar2;
  pointer __s2;
  size_t sVar3;
  FormulaNewParam *pFVar4;
  size_t __n;
  int iVar5;
  size_t sVar6;
  bool bVar7;
  bool bVar8;
  size_t local_38;
  
  uVar1 = (formula->mNewParams).super_ArrayPrimitiveType<COLLADAFW::FormulaNewParam_*>.mCount;
  bVar7 = uVar1 != 0;
  if (bVar7) {
    ppFVar2 = (formula->mNewParams).super_ArrayPrimitiveType<COLLADAFW::FormulaNewParam_*>.mData;
    __s2 = (parameterName->_M_dataplus)._M_p;
    sVar3 = parameterName->_M_string_length;
    sVar6 = 0;
    do {
      pFVar4 = ppFVar2[sVar6];
      __n = (pFVar4->mName)._M_string_length;
      if (__n == sVar3) {
        if (__n == 0) {
          bVar8 = true;
        }
        else {
          iVar5 = bcmp((pFVar4->mName)._M_dataplus._M_p,__s2,__n);
          bVar8 = iVar5 == 0;
        }
      }
      else {
        bVar8 = false;
      }
      if (bVar8) {
        *found = true;
        local_38 = sVar6;
        break;
      }
      sVar6 = sVar6 + 1;
      bVar7 = sVar6 < uVar1;
    } while (sVar6 != uVar1);
  }
  if (!bVar7) {
    *found = false;
    local_38 = 0;
  }
  return local_38;
}

Assistant:

size_t FormulasLinker::getNewParamIndex(const COLLADAFW::Formula* formula, const String& parameterName, bool &found)
	{
		const COLLADAFW::FormulaNewParamPointerArray& newParams = formula->getNewParams();
		for ( size_t i = 0, count = newParams.getCount(); i < count; ++i)
		{
			const COLLADAFW::FormulaNewParam* newParam = newParams[i];
			if ( newParam->getName() == parameterName )
			{
				found = true;
				return i;
			}
		}
		found = false;
		return 0;
	}